

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

int __thiscall mkvmuxer::Segment::WriteFramesAll(Segment *this)

{
  Cluster *this_00;
  Frame **ppFVar1;
  Frame *pFVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  if (this->frames_ == (Frame **)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = -1;
    if ((0 < (long)this->cluster_list_size_) &&
       (this_00 = this->cluster_list_[(long)this->cluster_list_size_ + -1],
       this_00 != (Cluster *)0x0)) {
      if (0 < this->frames_size_) {
        lVar6 = 0;
        do {
          ppFVar1 = this->frames_;
          pFVar2 = ppFVar1[lVar6];
          if (pFVar2->discard_padding_ != 0) {
            this->doc_type_version_ = 4;
          }
          bVar4 = Cluster::QueueOrWriteFrame(this_00,pFVar2);
          if (!bVar4) {
            return -1;
          }
          if (this->new_cuepoint_ == true) {
            if ((this->cues_track_ == ppFVar1[lVar6]->track_number_) &&
               (bVar4 = AddCuePoint(this,ppFVar1[lVar6]->timestamp_,this->cues_track_), !bVar4)) {
              return -1;
            }
          }
          pFVar2 = ppFVar1[lVar6];
          uVar3 = pFVar2->timestamp_;
          if (this->last_timestamp_ < uVar3) {
            this->last_timestamp_ = uVar3;
            this->last_track_timestamp_[pFVar2->track_number_ - 1] = uVar3;
          }
          if (pFVar2 != (Frame *)0x0) {
            Frame::~Frame(pFVar2);
            operator_delete(pFVar2);
          }
          ppFVar1[lVar6] = (Frame *)0x0;
          lVar6 = lVar6 + 1;
        } while (lVar6 < this->frames_size_);
      }
      iVar5 = this->frames_size_;
      this->frames_size_ = 0;
    }
  }
  return iVar5;
}

Assistant:

int Segment::WriteFramesAll() {
  if (frames_ == NULL)
    return 0;

  if (cluster_list_size_ < 1)
    return -1;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];

  if (!cluster)
    return -1;

  for (int32_t i = 0; i < frames_size_; ++i) {
    Frame*& frame = frames_[i];
    // TODO(jzern/vigneshv): using Segment::AddGenericFrame here would limit the
    // places where |doc_type_version_| needs to be updated.
    if (frame->discard_padding() != 0)
      doc_type_version_ = 4;
    if (!cluster->AddFrame(frame))
      return -1;

    if (new_cuepoint_ && cues_track_ == frame->track_number()) {
      if (!AddCuePoint(frame->timestamp(), cues_track_))
        return -1;
    }

    if (frame->timestamp() > last_timestamp_) {
      last_timestamp_ = frame->timestamp();
      last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
    }

    delete frame;
    frame = NULL;
  }

  const int result = frames_size_;
  frames_size_ = 0;

  return result;
}